

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O3

int mbedtls_camellia_crypt_cfb128
              (mbedtls_camellia_context *ctx,int mode,size_t length,size_t *iv_off,uchar *iv,
              uchar *input,uchar *output)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  size_t sVar5;
  
  uVar3 = *iv_off;
  iVar4 = -0x24;
  if (uVar3 < 0x10) {
    if (mode == 0) {
      if (length != 0) {
        sVar5 = 0;
        iVar4 = 0;
        do {
          if (uVar3 == 0) {
            mbedtls_camellia_crypt_ecb(ctx,iVar4,iv,iv);
          }
          bVar1 = input[sVar5];
          output[sVar5] = iv[uVar3] ^ bVar1;
          iv[uVar3] = bVar1;
          uVar3 = (ulong)((int)uVar3 + 1U & 0xf);
          sVar5 = sVar5 + 1;
        } while (length != sVar5);
      }
    }
    else if (length != 0) {
      sVar5 = 0;
      do {
        if (uVar3 == 0) {
          mbedtls_camellia_crypt_ecb(ctx,mode,iv,iv);
        }
        bVar1 = input[sVar5];
        bVar2 = iv[uVar3];
        output[sVar5] = bVar1 ^ bVar2;
        iv[uVar3] = bVar1 ^ bVar2;
        uVar3 = (ulong)((int)uVar3 + 1U & 0xf);
        sVar5 = sVar5 + 1;
      } while (length != sVar5);
    }
    *iv_off = uVar3;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int mbedtls_camellia_crypt_cfb128( mbedtls_camellia_context *ctx,
                       int mode,
                       size_t length,
                       size_t *iv_off,
                       unsigned char iv[16],
                       const unsigned char *input,
                       unsigned char *output )
{
    int c;
    size_t n;
    CAMELLIA_VALIDATE_RET( ctx != NULL );
    CAMELLIA_VALIDATE_RET( mode == MBEDTLS_CAMELLIA_ENCRYPT ||
                           mode == MBEDTLS_CAMELLIA_DECRYPT );
    CAMELLIA_VALIDATE_RET( iv     != NULL );
    CAMELLIA_VALIDATE_RET( iv_off != NULL );
    CAMELLIA_VALIDATE_RET( length == 0 || input  != NULL );
    CAMELLIA_VALIDATE_RET( length == 0 || output != NULL );

    n = *iv_off;
    if( n >= 16 )
        return( MBEDTLS_ERR_CAMELLIA_BAD_INPUT_DATA );

    if( mode == MBEDTLS_CAMELLIA_DECRYPT )
    {
        while( length-- )
        {
            if( n == 0 )
                mbedtls_camellia_crypt_ecb( ctx, MBEDTLS_CAMELLIA_ENCRYPT, iv, iv );

            c = *input++;
            *output++ = (unsigned char)( c ^ iv[n] );
            iv[n] = (unsigned char) c;

            n = ( n + 1 ) & 0x0F;
        }
    }
    else
    {
        while( length-- )
        {
            if( n == 0 )
                mbedtls_camellia_crypt_ecb( ctx, MBEDTLS_CAMELLIA_ENCRYPT, iv, iv );

            iv[n] = *output++ = (unsigned char)( iv[n] ^ *input++ );

            n = ( n + 1 ) & 0x0F;
        }
    }

    *iv_off = n;

    return( 0 );
}